

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
GeneratedMessageReflectionCordAccessorsTest_CordSingularOneofBytes_Test::TestBody
          (GeneratedMessageReflectionCordAccessorsTest_CordSingularOneofBytes_Test *this)

{
  bool bVar1;
  Cord *pCVar2;
  char *pcVar3;
  char *in_R9;
  string_view value;
  string local_1d0;
  AssertHelper local_1b0;
  Message local_1a8;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__2;
  Message local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_1;
  allocator<char> local_151;
  string local_150 [8];
  string string_value;
  AssertHelper local_110;
  Message local_108;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  string_view local_70;
  undefined1 local_60 [8];
  Cord cord_value;
  TestOneof2 message;
  GeneratedMessageReflectionCordAccessorsTest_CordSingularOneofBytes_Test *this_local;
  
  proto2_unittest::TestOneof2::TestOneof2
            ((TestOneof2 *)((long)&cord_value.contents_.data_.rep_.field_0 + 8));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"test");
  absl::lts_20250127::Cord::Cord((Cord *)local_60,local_70);
  proto2_unittest::TestOneof2::set_foo_bytes_cord
            ((TestOneof2 *)((long)&cord_value.contents_.data_.rep_.field_0 + 8),(Cord *)local_60);
  pCVar2 = proto2_unittest::TestOneof2::foo_bytes_cord
                     ((TestOneof2 *)((long)&cord_value.contents_.data_.rep_.field_0 + 8));
  testing::internal::EqHelper::Compare<char[5],_absl::lts_20250127::Cord,_nullptr>
            ((EqHelper *)local_90,"\"test\"","message.foo_bytes_cord()",(char (*) [5])0x21355a8,
             pCVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x68a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_b1 = proto2_unittest::TestOneof2::has_foo_bytes_cord
                       ((TestOneof2 *)((long)&cord_value.contents_.data_.rep_.field_0 + 8));
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_b0,
               (AssertionResult *)"message.has_foo_bytes_cord()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x68c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  proto2_unittest::TestOneof2::clear_foo
            ((TestOneof2 *)((long)&cord_value.contents_.data_.rep_.field_0 + 8));
  local_f9 = proto2_unittest::TestOneof2::has_foo_bytes_cord
                       ((TestOneof2 *)((long)&cord_value.contents_.data_.rep_.field_0 + 8));
  local_f9 = !local_f9;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&string_value.field_2 + 8),(internal *)local_f8,
               (AssertionResult *)"message.has_foo_bytes_cord()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x68e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)(string_value.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"test",&local_151);
  std::allocator<char>::~allocator(&local_151);
  value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_150);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )value._M_len;
  proto2_unittest::TestOneof2::set_foo_bytes_cord
            ((TestOneof2 *)((long)&cord_value.contents_.data_.rep_.field_0 + 8),value);
  pCVar2 = proto2_unittest::TestOneof2::foo_bytes_cord
                     ((TestOneof2 *)((long)&cord_value.contents_.data_.rep_.field_0 + 8));
  testing::internal::EqHelper::Compare<char[5],_absl::lts_20250127::Cord,_nullptr>
            ((EqHelper *)local_178,"\"test\"","message.foo_bytes_cord()",(char (*) [5])0x21355a8,
             pCVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x692,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_199 = proto2_unittest::TestOneof2::has_foo_bytes_cord
                        ((TestOneof2 *)((long)&cord_value.contents_.data_.rep_.field_0 + 8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d0,(internal *)local_198,(AssertionResult *)"message.has_foo_bytes_cord()",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x693,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::__cxx11::string::~string(local_150);
  absl::lts_20250127::Cord::~Cord((Cord *)local_60);
  proto2_unittest::TestOneof2::~TestOneof2
            ((TestOneof2 *)((long)&cord_value.contents_.data_.rep_.field_0 + 8));
  return;
}

Assistant:

TEST_F(GeneratedMessageReflectionCordAccessorsTest, CordSingularOneofBytes) {
  unittest::TestOneof2 message;
  absl::Cord cord_value("test");
  message.set_foo_bytes_cord(cord_value);
  EXPECT_EQ("test", message.foo_bytes_cord());

  EXPECT_TRUE(message.has_foo_bytes_cord());
  message.clear_foo();
  EXPECT_FALSE(message.has_foo_bytes_cord());

  std::string string_value = "test";
  message.set_foo_bytes_cord(string_value);
  EXPECT_EQ("test", message.foo_bytes_cord());
  EXPECT_TRUE(message.has_foo_bytes_cord());
}